

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verstring.c
# Opt level: O0

int ssh_versioncmp(char *a,char *b)

{
  ulong uVar1;
  ulong uVar2;
  unsigned_long bv;
  unsigned_long av;
  char *be;
  char *ae;
  char *b_local;
  char *a_local;
  
  ae = b;
  b_local = a;
  uVar1 = strtoul(a,&be,10);
  uVar2 = strtoul(ae,(char **)&av,10);
  if (uVar1 == uVar2) {
    if (*be == '.') {
      be = be + 1;
    }
    if (*(char *)av == '.') {
      av = av + 1;
    }
    uVar1 = strtoul(be,&be,10);
    uVar2 = strtoul((char *)av,(char **)&av,10);
    if (uVar1 == uVar2) {
      a_local._4_4_ = 0;
    }
    else {
      a_local._4_4_ = 1;
      if (uVar1 < uVar2) {
        a_local._4_4_ = -1;
      }
    }
  }
  else {
    a_local._4_4_ = 1;
    if (uVar1 < uVar2) {
      a_local._4_4_ = -1;
    }
  }
  return a_local._4_4_;
}

Assistant:

static int ssh_versioncmp(const char *a, const char *b)
{
    char *ae, *be;
    unsigned long av, bv;

    av = strtoul(a, &ae, 10);
    bv = strtoul(b, &be, 10);
    if (av != bv)
        return (av < bv ? -1 : +1);
    if (*ae == '.')
        ae++;
    if (*be == '.')
        be++;
    av = strtoul(ae, &ae, 10);
    bv = strtoul(be, &be, 10);
    if (av != bv)
        return (av < bv ? -1 : +1);
    return 0;
}